

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_objref.cpp
# Opt level: O2

int ON_COMPONENT_INDEX::Compare(ON_COMPONENT_INDEX *lhs,ON_COMPONENT_INDEX *rhs)

{
  if ((int)rhs->m_type <= (int)lhs->m_type) {
    if ((int)rhs->m_type < (int)lhs->m_type) {
      return 1;
    }
    if (rhs->m_index <= lhs->m_index) {
      return (int)(rhs->m_index < lhs->m_index);
    }
  }
  return -1;
}

Assistant:

int ON_COMPONENT_INDEX::Compare( const ON_COMPONENT_INDEX* lhs, const ON_COMPONENT_INDEX* rhs )
{
  const int lhs_i = (int)lhs->m_type;
  const int rhs_i = (int)rhs->m_type;
  if (lhs_i < rhs_i)
    return -1;
  if (lhs_i > rhs_i)
    return 1;

  if (lhs->m_index < rhs->m_index)
    return -1;
  if (lhs->m_index > rhs->m_index)
    return 1;
  return 0;
}